

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

shared_ptr<pbrt::syntactic::ParamArray<float>_> __thiscall
pbrt::syntactic::Param::as<float>(Param *this)

{
  ulong extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  undefined1 auVar2 [16];
  shared_ptr<pbrt::syntactic::ParamArray<float>_> sVar3;
  long local_20;
  element_type *local_18;
  
  std::__shared_ptr<pbrt::syntactic::Param,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<pbrt::syntactic::Param,void>
            ((__shared_ptr<pbrt::syntactic::Param,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (__weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  if (local_20 == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = extraout_RDX;
    auVar2 = auVar2 << 0x40;
  }
  else {
    auVar2 = __dynamic_cast(local_20,&typeinfo,&ParamArray<float>::typeinfo,0);
  }
  _Var1._M_pi = auVar2._8_8_;
  if (auVar2._0_8_ == (_func_int **)0x0) {
    this->_vptr_Param = (_func_int **)0x0;
    (this->super_enable_shared_from_this<pbrt::syntactic::Param>)._M_weak_this.
    super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    this->_vptr_Param = auVar2._0_8_;
    (this->super_enable_shared_from_this<pbrt::syntactic::Param>)._M_weak_this.
    super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
    if (local_18 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_18->super_enable_shared_from_this<pbrt::syntactic::Param>)._M_weak_this.
                 super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(local_18->super_enable_shared_from_this<pbrt::syntactic::Param>)._M_weak_this
                      .super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             1;
        UNLOCK();
      }
      else {
        *(int *)&(local_18->super_enable_shared_from_this<pbrt::syntactic::Param>)._M_weak_this.
                 super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(local_18->super_enable_shared_from_this<pbrt::syntactic::Param>)._M_weak_this
                      .super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             1;
      }
    }
  }
  if (local_18 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar3.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pbrt::syntactic::ParamArray<float>_>)
         sVar3.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ParamArray<T>> Param::as()
    { return std::dynamic_pointer_cast<ParamArray<T>>(shared_from_this()); }